

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1e8ba::CpuTest_lsr_a_clears_c_z_n_flags_Test::
CpuTest_lsr_a_clears_c_z_n_flags_Test(CpuTest_lsr_a_clears_c_z_n_flags_Test *this)

{
  CpuTest_lsr_a_clears_c_z_n_flags_Test *this_local;
  
  n_e_s::core::test::CpuTest::CpuTest(&this->super_CpuTest);
  (this->super_CpuTest).super_Test._vptr_Test =
       (_func_int **)&PTR__CpuTest_lsr_a_clears_c_z_n_flags_Test_003e7920;
  return;
}

Assistant:

TEST_F(CpuTest, lsr_a_clears_c_z_n_flags) {
    stage_instruction(LSR_ACC);
    registers.a = 0b00000010;
    registers.p = static_cast<uint8_t>(Z_FLAG | C_FLAG) | N_FLAG;
    expected.a = 0b00000001;
    expected.p = 0;

    step_execution(2);
    EXPECT_EQ(expected, registers);
}